

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  int *piVar4;
  JBLOCKROW paJVar5;
  d_derived_tbl *htbl;
  short sVar6;
  boolean bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  JCOEF *pJVar11;
  long lVar12;
  int pos;
  int look;
  int nb;
  int newnz_pos [64];
  int num_newnz;
  d_derived_tbl *tbl;
  bitread_working_state br_state;
  _func_void_j_decompress_ptr *p_Stack_68;
  int bits_left;
  bit_buf_type get_buffer;
  JCOEFPTR thiscoef;
  JBLOCKROW block;
  int *natural_order;
  int m1;
  int p1;
  int Se;
  uint EOBRUN;
  int r;
  int k;
  int s;
  huff_entropy_ptr entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar3[3].decode_mcu != 0)) ||
     (bVar7 = process_restart(cinfo), bVar7 != 0)) {
    if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
      iVar1 = cinfo->Se;
      uVar8 = 1 << ((byte)cinfo->Al & 0x1f);
      iVar9 = -1 << ((byte)cinfo->Al & 0x1f);
      piVar4 = cinfo->natural_order;
      tbl = (d_derived_tbl *)cinfo->src->next_input_byte;
      br_state.next_input_byte = (JOCTET *)cinfo->src->bytes_in_buffer;
      p_Stack_68 = pjVar3[1].start_pass;
      br_state.cinfo._4_4_ = *(int *)&pjVar3[1].decode_mcu;
      p1 = *(int *)&pjVar3[2].start_pass;
      paJVar5 = *MCU_data;
      htbl = (d_derived_tbl *)pjVar3[6].start_pass;
      newnz_pos[0x3f] = 0;
      EOBRUN = cinfo->Ss;
      sVar6 = (short)iVar9;
      br_state._24_8_ = cinfo;
      if (p1 == 0) {
        for (; (int)EOBRUN <= iVar1; EOBRUN = EOBRUN + 1) {
          if (br_state.cinfo._4_4_ < 8) {
            bVar7 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                               br_state.cinfo._4_4_,0);
            if (bVar7 == 0) goto LAB_0039aac1;
            p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            if (7 < (int)br_state.get_buffer) goto LAB_0039a656;
            pos = 1;
LAB_0039a6c4:
            r = jpeg_huff_decode((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                 br_state.cinfo._4_4_,htbl,pos);
            if (r < 0) goto LAB_0039aac1;
            p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          }
          else {
LAB_0039a656:
            uVar10 = (uint)((long)p_Stack_68 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
            if (htbl->look_nbits[(int)uVar10] == 0) {
              pos = 9;
              goto LAB_0039a6c4;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - htbl->look_nbits[(int)uVar10];
            r = (int)htbl->look_sym[(int)uVar10];
          }
          Se = r >> 4;
          if ((r & 0xfU) == 0) {
            if (Se != 0xf) {
              p1 = 1 << ((byte)Se & 0x1f);
              if (Se != 0) {
                if (br_state.cinfo._4_4_ < Se) {
                  bVar7 = jpeg_fill_bit_buffer
                                    ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                     br_state.cinfo._4_4_,Se);
                  if (bVar7 == 0) goto LAB_0039aac1;
                  p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
                  br_state.cinfo._4_4_ = (int)br_state.get_buffer;
                }
                br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - Se;
                p1 = ((uint)((long)p_Stack_68 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) & bmask[Se]) +
                     p1;
              }
              break;
            }
            r = 0;
          }
          else {
            if ((r & 0xfU) != 1) {
              cinfo->err->msg_code = 0x79;
              (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
            }
            if (br_state.cinfo._4_4_ < 1) {
              bVar7 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                 br_state.cinfo._4_4_,1);
              if (bVar7 == 0) goto LAB_0039aac1;
              p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ + -1;
            r = iVar9;
            if (((long)p_Stack_68 >> ((byte)br_state.cinfo._4_4_ & 0x3f) & (ulong)1) != 0) {
              r = uVar8;
            }
          }
          do {
            pJVar11 = *paJVar5 + piVar4[(int)EOBRUN];
            if (*pJVar11 == 0) {
              Se = Se + -1;
              if (Se < 0) break;
            }
            else {
              if (br_state.cinfo._4_4_ < 1) {
                bVar7 = jpeg_fill_bit_buffer
                                  ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                   br_state.cinfo._4_4_,1);
                if (bVar7 == 0) goto LAB_0039aac1;
                p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
                br_state.cinfo._4_4_ = (int)br_state.get_buffer;
              }
              br_state.cinfo._4_4_ = br_state.cinfo._4_4_ + -1;
              if ((((long)p_Stack_68 >> ((byte)br_state.cinfo._4_4_ & 0x3f) & (ulong)1) != 0) &&
                 (((int)*pJVar11 & uVar8) == 0)) {
                if (*pJVar11 < 0) {
                  *pJVar11 = *pJVar11 + sVar6;
                }
                else {
                  *pJVar11 = *pJVar11 + (short)uVar8;
                }
              }
            }
            EOBRUN = EOBRUN + 1;
          } while ((int)EOBRUN <= iVar1);
          if (r != 0) {
            iVar2 = piVar4[(int)EOBRUN];
            (*paJVar5)[iVar2] = (JCOEF)r;
            lVar12 = (long)newnz_pos[0x3f];
            newnz_pos[0x3f] = newnz_pos[0x3f] + 1;
            (&look)[lVar12] = iVar2;
          }
        }
      }
      if (p1 != 0) {
        for (; (int)EOBRUN <= iVar1; EOBRUN = EOBRUN + 1) {
          pJVar11 = *paJVar5 + piVar4[(int)EOBRUN];
          if (*pJVar11 != 0) {
            if (br_state.cinfo._4_4_ < 1) {
              bVar7 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                 br_state.cinfo._4_4_,1);
              if (bVar7 == 0) {
LAB_0039aac1:
                while (0 < newnz_pos[0x3f]) {
                  newnz_pos[0x3f] = newnz_pos[0x3f] + -1;
                  (*paJVar5)[(&look)[newnz_pos[0x3f]]] = 0;
                }
                return 0;
              }
              p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ + -1;
            if ((((long)p_Stack_68 >> ((byte)br_state.cinfo._4_4_ & 0x3f) & (ulong)1) != 0) &&
               (((int)*pJVar11 & uVar8) == 0)) {
              if (*pJVar11 < 0) {
                *pJVar11 = *pJVar11 + sVar6;
              }
              else {
                *pJVar11 = *pJVar11 + (short)uVar8;
              }
            }
          }
        }
        p1 = p1 + -1;
      }
      cinfo->src->next_input_byte = (JOCTET *)tbl;
      cinfo->src->bytes_in_buffer = (size_t)br_state.next_input_byte;
      pjVar3[1].start_pass = p_Stack_68;
      *(int *)&pjVar3[1].decode_mcu = br_state.cinfo._4_4_;
      *(int *)&pjVar3[2].start_pass = p1;
    }
    *(int *)&pjVar3[3].decode_mcu = *(int *)&pjVar3[3].decode_mcu + -1;
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, p1, m1;
  const int * natural_order;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;
  int num_newnz;
  int newnz_pos[DCTSIZE2];

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, don't modify the MCU.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    p1 = 1 << cinfo->Al;	/* 1 in the bit position being coded */
    m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */
    natural_order = cinfo->natural_order;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    EOBRUN = entropy->saved.EOBRUN; /* only part of saved state we need */

    /* There is always only one block per MCU */
    block = MCU_data[0];
    tbl = entropy->ac_derived_tbl;

    /* If we are forced to suspend, we must undo the assignments to any newly
     * nonzero coefficients in the block, because otherwise we'd get confused
     * next time about which coefficients were already nonzero.
     * But we need not undo addition of bits to already-nonzero coefficients;
     * instead, we can test the current bit to see if we already did it.
     */
    num_newnz = 0;

    /* initialize coefficient loop counter to start of band */
    k = cinfo->Ss;

    if (EOBRUN == 0) {
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, goto undoit, label3);
	r = s >> 4;
	s &= 15;
	if (s) {
	  if (s != 1)		/* size of new coef should always be 1 */
	    WARNMS(cinfo, JWRN_HUFF_BAD_CODE);
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1))
	    s = p1;		/* newly nonzero coef is positive */
	  else
	    s = m1;		/* newly nonzero coef is negative */
	} else {
	  if (r != 15) {
	    EOBRUN = 1 << r;	/* EOBr, run length is 2^r + appended bits */
	    if (r) {
	      CHECK_BIT_BUFFER(br_state, r, goto undoit);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    break;		/* rest of block is handled by EOB logic */
	  }
	  /* note s = 0 for processing ZRL */
	}
	/* Advance over already-nonzero coefs and r still-zero coefs,
	 * appending correction bits to the nonzeroes.  A correction bit is 1
	 * if the absolute value of the coefficient must be increased.
	 */
	do {
	  thiscoef = *block + natural_order[k];
	  if (*thiscoef != 0) {
	    CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	    if (GET_BITS(1)) {
	      if ((*thiscoef & p1) == 0) { /* do nothing if already set it */
		if (*thiscoef >= 0)
		  *thiscoef += p1;
		else
		  *thiscoef += m1;
	      }
	    }
	  } else {
	    if (--r < 0)
	      break;		/* reached target zero coefficient */
	  }
	  k++;
	} while (k <= Se);
	if (s) {
	  int pos = natural_order[k];
	  /* Output newly nonzero coefficient */
	  (*block)[pos] = (JCOEF) s;
	  /* Remember its position in case we have to suspend */
	  newnz_pos[num_newnz++] = pos;
	}
      }
    }

    if (EOBRUN > 0) {
      /* Scan any remaining coefficient positions after the end-of-band
       * (the last newly nonzero coefficient, if any).  Append a correction
       * bit to each already-nonzero coefficient.  A correction bit is 1
       * if the absolute value of the coefficient must be increased.
       */
      for (; k <= Se; k++) {
	thiscoef = *block + natural_order[k];
	if (*thiscoef != 0) {
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1)) {
	    if ((*thiscoef & p1) == 0) { /* do nothing if already changed it */
	      if (*thiscoef >= 0)
		*thiscoef += p1;
	      else
		*thiscoef += m1;
	    }
	  }
	}
      }
      /* Count one block completed in EOB run */
      EOBRUN--;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    entropy->saved.EOBRUN = EOBRUN; /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;

undoit:
  /* Re-zero any output coefficients that we made newly nonzero */
  while (num_newnz > 0)
    (*block)[newnz_pos[--num_newnz]] = 0;

  return FALSE;
}